

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZydisFuzzShared.c
# Opt level: O2

void ZydisReEncodeInstruction
               (ZydisDecoder *decoder,ZydisDecodedInstruction *insn1,ZydisDecodedOperand *operands1,
               ZyanU8 operand_count,ZyanU8 *insn1_bytes)

{
  bool bVar1;
  ZyanStatus ZVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  ZydisEncoderOperandImm_ *result_address;
  ZydisDecodedOperand *operands;
  ulong uVar6;
  char *__s;
  ZydisEncoderOperandImm_ *pZVar7;
  long lVar8;
  ZyanU8 encoded_instruction [15];
  ZyanUSize encoded_length;
  ZyanU8 insn1_bytes_1 [15];
  ZydisDecodedInstruction insn2;
  ZydisEncoderRequest request;
  ZydisDecodedOperand operands2 [10];
  ZyanU8 local_65f [15];
  ZyanUSize local_650;
  ZyanUSize local_648;
  undefined1 local_63f [15];
  ZydisDecodedInstruction local_630;
  ZydisEncoderRequest local_4e8;
  ZydisDecodedOperand local_358 [10];
  
  ZydisPrintInstruction(insn1,operands1,operand_count,insn1_bytes);
  ZydisValidateEnumRanges(insn1,operands1,operand_count);
  if (operand_count < insn1->operand_count_visible) {
    __assert_fail("operand_count >= insn1->operand_count_visible",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/tools/ZydisFuzzShared.c"
                  ,0x1dd,
                  "void ZydisReEncodeInstruction(const ZydisDecoder *, const ZydisDecodedInstruction *, const ZydisDecodedOperand *, ZyanU8, const ZyanU8 *)"
                 );
  }
  ZVar2 = ZydisEncoderDecodedInstructionToEncoderRequest
                    (insn1,operands1,insn1->operand_count_visible,&local_4e8);
  if ((int)ZVar2 < 0) {
    __s = "ZydisEncoderDecodedInstructionToEncoderRequest failed\n";
  }
  else {
    local_650 = 0xf;
    ZVar2 = ZydisEncoderEncodeInstruction(&local_4e8,local_65f,&local_650);
    if ((int)ZVar2 < 0) {
      __s = "Failed to re-encode instruction\n";
    }
    else {
      ZVar2 = ZydisDecoderDecodeFull(decoder,local_65f,local_650,&local_630,local_358);
      if ((int)ZVar2 < 0) {
        __s = "Failed to decode re-encoded instruction\n";
      }
      else {
        operands = local_358;
        ZydisPrintInstruction(&local_630,operands,local_630.operand_count_visible,local_65f);
        ZydisValidateEnumRanges(&local_630,operands,local_630.operand_count_visible);
        ZydisValidateInstructionIdentity(insn1,operands1,&local_630,operands);
        uVar4 = (ulong)local_630.length;
        if (insn1->length < local_630.length) {
          __s = "Suboptimal output size detected\n";
        }
        else {
          lVar5 = 0x8000;
          if (local_630.address_width != '\x10') {
            if (local_630.address_width == '@') {
              lVar5 = -0x8000000000000000;
            }
            else {
              if (local_630.address_width != ' ') {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/tools/ZydisFuzzShared.c"
                              ,0x196,
                              "void ZydisReEncodeInstructionAbsolute(ZydisEncoderRequest *, const ZydisDecodedInstruction *, const ZydisDecodedOperand *, const ZyanU8 *)"
                             );
              }
              lVar5 = 0x80000000;
            }
          }
          lVar8 = 0x8000;
          if (local_630.operand_width != '\x10') {
            lVar8 = lVar5;
          }
          if (local_630.machine_mode == ZYDIS_MACHINE_MODE_LONG_64) {
            lVar8 = lVar5;
          }
          pZVar7 = &local_4e8.operands[0].imm;
          bVar1 = false;
          for (uVar6 = 0; uVar6 < local_4e8.operand_count; uVar6 = uVar6 + 1) {
            if (((ZydisEncoderOperand *)(pZVar7 + -7))->type == ZYDIS_OPERAND_TYPE_MEMORY) {
              if (((operands->field_10).mem.base & ~ZYDIS_REGISTER_AL) == ZYDIS_REGISTER_EIP) {
                result_address =
                     (ZydisEncoderOperandImm_ *)&local_4e8.operands[uVar6].mem.displacement;
                goto LAB_0010f1f8;
              }
            }
            else if ((((ZydisEncoderOperand *)(pZVar7 + -7))->type == ZYDIS_OPERAND_TYPE_IMMEDIATE)
                    && (result_address = pZVar7, (operands->field_10).imm.is_relative != '\0')) {
LAB_0010f1f8:
              ZVar2 = ZydisCalcAbsoluteAddress(&local_630,operands,lVar8 - uVar4,&result_address->u)
              ;
              bVar1 = true;
              if ((int)ZVar2 < 0) {
                __s = "ZydisCalcAbsoluteAddress has failed\n";
                goto LAB_0010f28b;
              }
            }
            pZVar7 = pZVar7 + 8;
            operands = operands + 1;
          }
          if (!bVar1) {
            return;
          }
          local_648 = 0xf;
          ZVar2 = ZydisEncoderEncodeInstructionAbsolute
                            (&local_4e8,local_63f,&local_648,lVar8 - uVar4);
          if ((int)ZVar2 < 0) {
            __s = "Failed to re-encode instruction (absolute)\n";
          }
          else {
            if ((local_648 == local_630.length) &&
               (iVar3 = bcmp(local_63f,local_65f,local_648), iVar3 == 0)) {
              return;
            }
            __s = "Instruction mismatch (absolute)\n";
          }
        }
      }
    }
  }
LAB_0010f28b:
  fputs(__s,_stderr);
  abort();
}

Assistant:

void ZydisReEncodeInstruction(const ZydisDecoder *decoder, const ZydisDecodedInstruction *insn1,
    const ZydisDecodedOperand* operands1, ZyanU8 operand_count, const ZyanU8 *insn1_bytes)
{
    ZydisPrintInstruction(insn1, operands1, operand_count, insn1_bytes);
    ZydisValidateEnumRanges(insn1, operands1, operand_count);

    ZYAN_ASSERT(operand_count >= insn1->operand_count_visible);

    ZydisEncoderRequest request;
    ZyanStatus status = ZydisEncoderDecodedInstructionToEncoderRequest(insn1, operands1,
        insn1->operand_count_visible, &request);
    if (!ZYAN_SUCCESS(status))
    {
        fputs("ZydisEncoderDecodedInstructionToEncoderRequest failed\n", ZYAN_STDERR);
        abort();
    }

    ZyanU8 encoded_instruction[ZYDIS_MAX_INSTRUCTION_LENGTH];
    ZyanUSize encoded_length = sizeof(encoded_instruction);
    status = ZydisEncoderEncodeInstruction(&request, encoded_instruction, &encoded_length);
    if (!ZYAN_SUCCESS(status))
    {
        fputs("Failed to re-encode instruction\n", ZYAN_STDERR);
        abort();
    }

    ZydisDecodedInstruction insn2;
    ZydisDecodedOperand operands2[ZYDIS_MAX_OPERAND_COUNT];
    status = ZydisDecoderDecodeFull(decoder, encoded_instruction, encoded_length, &insn2,
        operands2);
    if (!ZYAN_SUCCESS(status))
    {
        fputs("Failed to decode re-encoded instruction\n", ZYAN_STDERR);
        abort();
    }

    ZydisPrintInstruction(&insn2, operands2, insn2.operand_count_visible, encoded_instruction);
    ZydisValidateEnumRanges(&insn2, operands2, insn2.operand_count_visible);
    ZydisValidateInstructionIdentity(insn1, operands1, &insn2, operands2);

    if (insn2.length > insn1->length)
    {
        fputs("Suboptimal output size detected\n", ZYAN_STDERR);
        abort();
    }

    ZydisReEncodeInstructionAbsolute(&request, &insn2, operands2, encoded_instruction);
}